

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SolverTypes.h
# Opt level: O1

void __thiscall
Minisat::
OccLists<int,_Minisat::vec<unsigned_int,_int>,_Minisat::SimpSolver::ClauseDeleted,_Minisat::MkIndexDefault<int>_>
::clean(OccLists<int,_Minisat::vec<unsigned_int,_int>,_Minisat::SimpSolver::ClauseDeleted,_Minisat::MkIndexDefault<int>_>
        *this,int *idx)

{
  vec<unsigned_int,_int> *this_00;
  vec<unsigned_int,_int> *pvVar1;
  bool bVar2;
  char *__function;
  long lVar3;
  long lVar4;
  Size nelems;
  long lVar5;
  int iVar6;
  
  iVar6 = *idx;
  if (iVar6 < (this->occs).map.sz) {
    pvVar1 = (this->occs).map.data;
    this_00 = pvVar1 + iVar6;
    if (pvVar1[iVar6].sz < 1) {
      nelems = 0;
    }
    else {
      lVar4 = 0;
      lVar5 = 0;
      iVar6 = 0;
      do {
        bVar2 = SimpSolver::ClauseDeleted::operator()
                          (&this->deleted,(CRef *)((long)this_00->data + lVar4));
        if (!bVar2) {
          lVar3 = (long)iVar6;
          iVar6 = iVar6 + 1;
          this_00->data[lVar3] = *(uint *)((long)this_00->data + lVar4);
        }
        lVar5 = lVar5 + 1;
        lVar4 = lVar4 + 4;
      } while (lVar5 < this_00->sz);
      nelems = (int)lVar5 - iVar6;
    }
    vec<unsigned_int,_int>::shrink(this_00,nelems);
    if (*idx < (this->dirty).map.sz) {
      (this->dirty).map.data[*idx] = '\0';
      return;
    }
    __function = 
    "V &Minisat::IntMap<int, char>::operator[](K) [K = int, V = char, MkIndex = Minisat::MkIndexDefault<int>]"
    ;
  }
  else {
    __function = 
    "V &Minisat::IntMap<int, Minisat::vec<unsigned int>>::operator[](K) [K = int, V = Minisat::vec<unsigned int>, MkIndex = Minisat::MkIndexDefault<int>]"
    ;
  }
  __assert_fail("has(k)",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/Udopia[P]minisat/minisat/mtl/IntMap.h"
                ,0x28,__function);
}

Assistant:

void OccLists<K,Vec,Deleted,MkIndex>::clean(const K& idx)
{
    Vec& vec = occs[idx];
    int  i, j;
    for (i = j = 0; i < vec.size(); i++)
        if (!deleted(vec[i]))
            vec[j++] = vec[i];
    vec.shrink(i - j);
    dirty[idx] = 0;
}